

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O1

void create_camera_demon(obj *camera,int x,int y)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  monst *worm;
  obj *poVar4;
  char *pcVar5;
  
  uVar2 = mt_random();
  if ((0x55555555 < uVar2 * -0x55555555) ||
     (worm = makemon(mons + 0x34,level,x,y,0), worm == (monst *)0x0)) {
    return;
  }
  if (worm->wormno == '\0') {
    if (((viz_array[worm->my][worm->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[worm->my][worm->mx] & 1U) == 0 || ((worm->data->mflags3 & 0x200) == 0))))))
    goto LAB_001bfa8a;
LAB_001bfa34:
    uVar2 = *(uint *)&worm->field_0x60;
    if (((uVar2 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
      if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001bfa7d;
      goto LAB_001bfa8a;
    }
    if ((uVar2 & 0x280) != 0) goto LAB_001bfa8a;
LAB_001bfa7d:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001bfa8a;
  }
  else {
    bVar1 = worm_known(level,worm);
    if (bVar1 != '\0') goto LAB_001bfa34;
LAB_001bfa8a:
    if (((worm->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(worm,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(worm,4), poVar4->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
            (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
            youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
        if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001bfbc4;
        iVar3 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy);
        if ((iVar3 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_001bfbf4;
        goto LAB_001bfbd4;
      }
    }
    else {
LAB_001bfbc4:
      if (u.uprops[0x42].intrinsic == 0) {
LAB_001bfbd4:
        if ((u.uprops[0x42].extrinsic == 0) && (bVar1 = match_warn_of_mon(worm), bVar1 == '\0')) {
          pcVar5 = "Something";
          goto LAB_001bfc4b;
        }
      }
    }
  }
LAB_001bfbf4:
  pcVar5 = "The picture-painting demon";
  if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
     ((u.umonnum == u.umonster || (bVar1 = dmgtype(youmonst.data,0x24), bVar1 == '\0')))) {
    pcVar5 = rndmonnam();
    pcVar5 = An(pcVar5);
  }
LAB_001bfc4b:
  pline("%s is released!",pcVar5);
  *(uint *)&worm->field_0x60 =
       (*(uint *)&worm->field_0x60 & 0xffbfffff | (*(uint *)&camera->field_0x4a & 1) << 0x16) ^
       0x400000;
  set_malign(worm);
  return;
}

Assistant:

void create_camera_demon(struct obj *camera, int x, int y)
{
	struct monst *mtmp;

	if (!rn2(3) &&
	    (mtmp = makemon(&mons[PM_HOMUNCULUS], level, x, y, NO_MM_FLAGS)) != 0) {
	    pline("%s is released!",
		  !canspotmon(level, mtmp) ? "Something" :
		  Hallucination ? An(rndmonnam()) :
		  "The picture-painting demon");
	    mtmp->mpeaceful = !camera->cursed;
	    set_malign(mtmp);
	}
}